

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkRayTracingPipelineCreateInfoKHR * __thiscall
Fossilize::StateRecorder::Impl::copy<VkRayTracingPipelineCreateInfoKHR>
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *src,size_t count,ScratchAllocator *alloc)

{
  VkRayTracingPipelineCreateInfoKHR *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkRayTracingPipelineCreateInfoKHR>(alloc,count);
    if (pVVar1 != (VkRayTracingPipelineCreateInfoKHR *)0x0) {
      pVVar1 = (VkRayTracingPipelineCreateInfoKHR *)memmove(pVVar1,src,count * 0x68);
      return pVVar1;
    }
  }
  return (VkRayTracingPipelineCreateInfoKHR *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}